

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O0

SourceLoc * __thiscall
MiniScript::Context::GetSourceLoc(SourceLoc *__return_storage_ptr__,Context *this)

{
  long lVar1;
  long lVar2;
  TACLine *pTVar3;
  Context *this_local;
  
  if ((-1 < this->lineNum) &&
     (lVar1 = this->lineNum, lVar2 = List<MiniScript::TACLine>::Count(&this->code), lVar1 < lVar2))
  {
    pTVar3 = List<MiniScript::TACLine>::operator[](&this->code,this->lineNum);
    SourceLoc::SourceLoc(__return_storage_ptr__,&pTVar3->location);
    return __return_storage_ptr__;
  }
  SourceLoc::SourceLoc(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

SourceLoc Context::GetSourceLoc() {
		if (lineNum < 0 || lineNum >= code.Count()) {
			return SourceLoc();
		}
		return code[lineNum].location;
	}